

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O2

void __thiscall
pstore::index::details::internal_node::insert_child
          (internal_node *this,hash_type hash,index_pointer leaf,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  pointer offset;
  span<pstore::index::details::index_pointer,__1L> sVar4;
  span<pstore::index::details::index_pointer,__1L> sVar5;
  span<pstore::index::details::index_pointer,__1L> span;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_90;
  span<pstore::index::details::index_pointer,__1L> d_span;
  span<pstore::index::details::index_pointer,__1L> children_span;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_60;
  span<pstore::index::details::index_pointer,__1L> local_50;
  span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,__1L>,_false> local_40;
  
  uVar3 = 1L << ((byte)hash & 0x3f);
  uVar2 = this->bitmap_;
  if ((uVar2 >> (hash & 0x3f) & 1) != 0) {
    assert_failed("(this->bitmap_ & bit_pos) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                  ,0x133);
  }
  if (uVar2 == 0xffffffffffffffff) {
    assert_failed("old_size < hash_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                  ,0x138);
  }
  offset = (pointer)POPCOUNT(uVar3 - 1 & uVar2);
  uVar1 = (uint)POPCOUNT(uVar2);
  if (uVar1 < (uint)offset) {
    assert_failed("index <= old_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                  ,0x139);
  }
  children_span = gsl::make_span<pstore::index::details::index_pointer>(this->children_,0x40);
  uVar2 = (ulong)(uVar1 - (uint)offset);
  gsl::span<pstore::index::details::index_pointer,_-1L>::subspan
            (&children_span,(index_type)offset,uVar2);
  d_span = gsl::span<pstore::index::details::index_pointer,_-1L>::subspan
                     (&children_span,(long)offset + 1,uVar2);
  sVar4 = gsl::span<pstore::index::details::index_pointer,_-1L>::last(&d_span,0);
  sVar5 = gsl::span<pstore::index::details::index_pointer,_-1L>::last(&children_span,0);
  if (sVar4.storage_.data_ <= sVar5.storage_.data_) {
    gsl::span<pstore::index::details::index_pointer,_-1L>::begin
              ((span<pstore::index::details::index_pointer,__1L> *)&local_90);
    gsl::span<pstore::index::details::index_pointer,_-1L>::end
              ((span<pstore::index::details::index_pointer,__1L> *)&local_40);
    gsl::span<pstore::index::details::index_pointer,_-1L>::end(&local_50);
    std::
    move_backward<pstore::gsl::details::span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_1l>,false>,pstore::gsl::details::span_iterator<pstore::gsl::span<pstore::index::details::index_pointer,_1l>,false>>
              (&local_60,&local_90,&local_40);
    this->children_[(long)offset] = leaf;
    uVar3 = uVar3 | this->bitmap_;
    this->bitmap_ = uVar3;
    if (uVar1 + 1 == (int)POPCOUNT(uVar3)) {
      children_span.storage_.data_ = offset;
      children_span.storage_.super_extent_type<_1L>.size_ = (ulong)this | 3;
      array_stack<pstore::index::details::parent_type,_13UL>::push
                (parents.ptr_,(value_type *)&children_span);
      return;
    }
    assert_failed("bit_count::pop_count (this->bitmap_) == old_size + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                  ,0x14a);
  }
  assert_failed("d_span.last (0).data () <= children_span.last (0).data ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                ,0x142);
}

Assistant:

void internal_node::insert_child (hash_type const hash, index_pointer const leaf,
                                              gsl::not_null<parent_stack *> const parents) {
                auto const hash_index = hash & details::hash_index_mask;
                auto const bit_pos = hash_type{1} << hash_index;
                PSTORE_ASSERT (bit_pos != 0); // guarantee that we didn't shift the bit to oblivion
                // check that this slot is free.
                PSTORE_ASSERT ((this->bitmap_ & bit_pos) ==
                               0); //! OCLINT(PH - bitwise in conditional)

                // Compute the child index by counting the number of 1 bits below bit_pos.
                unsigned const index = bit_count::pop_count (this->bitmap_ & (bit_pos - 1));
                unsigned const old_size = bit_count::pop_count (this->bitmap_);
                PSTORE_ASSERT (old_size < hash_size);
                PSTORE_ASSERT (index <= old_size);

                // Move elements from [index..old_size) to [index+1..old_size+1)
                {
                    auto const children_span = gsl::make_span (&children_[0], hash_size);
                    auto const num_to_move = old_size - index;

                    auto const span = children_span.subspan (index, num_to_move);
                    auto const d_span = children_span.subspan (index + 1, num_to_move);
                    PSTORE_ASSERT (d_span.last (0).data () <= children_span.last (0).data ());

                    std::move_backward (std::begin (span), std::end (span), std::end (d_span));
                }

                children_[index] = leaf;

                this->bitmap_ = this->bitmap_ | bit_pos;
                PSTORE_ASSERT (bit_count::pop_count (this->bitmap_) == old_size + 1);
                parents->push (parent_type{index_pointer{this}, index});
            }